

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O3

int generate_input(uint8_t *buf,int len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  char cVar23;
  undefined1 auVar24 [16];
  uint in_EAX;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar48;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar49;
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  int iVar72;
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar86;
  int iVar90;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long lVar52;
  
  auVar24 = _DAT_00104090;
  if (0 < len) {
    lVar25 = (ulong)(uint)len - 1;
    auVar38._8_4_ = (int)lVar25;
    auVar38._0_8_ = lVar25;
    auVar38._12_4_ = (int)((ulong)lVar25 >> 0x20);
    local_54 = 0xf;
    local_58 = 0xe;
    local_5c = 0xd;
    local_60 = 0xc;
    uVar31 = 0xb;
    uVar32 = 10;
    uVar33 = 9;
    uVar28 = 8;
    uVar29 = 7;
    uVar36 = 6;
    uVar37 = 5;
    uVar34 = 4;
    uVar35 = 3;
    uVar26 = 2;
    uVar30 = 1;
    uVar27 = 0;
    auVar39 = auVar38;
    auVar51 = _DAT_00104010;
    auVar53 = _DAT_00104020;
    auVar54 = _DAT_00104030;
    auVar55 = _DAT_00104040;
    auVar56 = _DAT_00104050;
    auVar57 = _DAT_00104060;
    auVar58 = _DAT_00104070;
    auVar59 = _DAT_00104080;
    do {
      auVar69 = auVar38 ^ auVar24;
      auVar73 = auVar59 ^ auVar24;
      iVar48 = auVar69._0_4_;
      iVar86 = -(uint)(iVar48 < auVar73._0_4_);
      iVar50 = auVar69._4_4_;
      auVar75._4_4_ = -(uint)(iVar50 < auVar73._4_4_);
      iVar71 = auVar69._8_4_;
      iVar90 = -(uint)(iVar71 < auVar73._8_4_);
      iVar72 = auVar69._12_4_;
      auVar75._12_4_ = -(uint)(iVar72 < auVar73._12_4_);
      auVar69._4_4_ = iVar86;
      auVar69._0_4_ = iVar86;
      auVar69._8_4_ = iVar90;
      auVar69._12_4_ = iVar90;
      auVar69 = pshuflw(auVar39,auVar69,0xe8);
      auVar74._4_4_ = -(uint)(auVar73._4_4_ == iVar50);
      auVar74._12_4_ = -(uint)(auVar73._12_4_ == iVar72);
      auVar74._0_4_ = auVar74._4_4_;
      auVar74._8_4_ = auVar74._12_4_;
      auVar60 = pshuflw(in_XMM11,auVar74,0xe8);
      auVar75._0_4_ = auVar75._4_4_;
      auVar75._8_4_ = auVar75._12_4_;
      auVar73 = pshuflw(auVar69,auVar75,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar73 | auVar60 & auVar69) ^ auVar39;
      auVar39 = packssdw(auVar39,auVar39);
      cVar23 = (char)uVar27;
      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        buf[uVar27] = (char)((uVar27 & 0xffffffff) / 0xfb) * '\x05' + cVar23;
      }
      auVar60._4_4_ = iVar86;
      auVar60._0_4_ = iVar86;
      auVar60._8_4_ = iVar90;
      auVar60._12_4_ = iVar90;
      auVar75 = auVar74 & auVar60 | auVar75;
      auVar39 = packssdw(auVar75,auVar75);
      auVar73._8_4_ = 0xffffffff;
      auVar73._0_8_ = 0xffffffffffffffff;
      auVar73._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar73,auVar39 ^ auVar73);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._0_4_ >> 8 & 1) != 0) {
        buf[uVar27 + 1] = (char)(uVar30 / 0xfb) * '\x05' + '\x01' + cVar23;
      }
      auVar39 = auVar58 ^ auVar24;
      auVar61._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar61._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar61._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar61._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar76._4_4_ = auVar61._0_4_;
      auVar76._0_4_ = auVar61._0_4_;
      auVar76._8_4_ = auVar61._8_4_;
      auVar76._12_4_ = auVar61._8_4_;
      iVar86 = -(uint)(auVar39._4_4_ == iVar50);
      iVar90 = -(uint)(auVar39._12_4_ == iVar72);
      auVar10._4_4_ = iVar86;
      auVar10._0_4_ = iVar86;
      auVar10._8_4_ = iVar90;
      auVar10._12_4_ = iVar90;
      auVar87._4_4_ = auVar61._4_4_;
      auVar87._0_4_ = auVar61._4_4_;
      auVar87._8_4_ = auVar61._12_4_;
      auVar87._12_4_ = auVar61._12_4_;
      auVar39 = auVar10 & auVar76 | auVar87;
      auVar39 = packssdw(auVar39,auVar39);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar1,auVar39 ^ auVar1);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
        buf[uVar27 + 2] = (char)(uVar26 / 0xfb) * '\x05' + '\x02' + cVar23;
      }
      auVar39 = pshufhw(auVar39,auVar76,0x84);
      auVar11._4_4_ = iVar86;
      auVar11._0_4_ = iVar86;
      auVar11._8_4_ = iVar90;
      auVar11._12_4_ = iVar90;
      auVar73 = pshufhw(auVar61,auVar11,0x84);
      auVar69 = pshufhw(auVar39,auVar87,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar69 | auVar73 & auVar39) ^ auVar40;
      auVar39 = packssdw(auVar40,auVar40);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._0_4_ >> 0x18 & 1) != 0) {
        buf[uVar27 + 3] = (char)(uVar35 / 0xfb) * '\x05' + '\x03' + cVar23;
      }
      auVar39 = auVar57 ^ auVar24;
      auVar62._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar62._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar62._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar62._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar12._4_4_ = auVar62._0_4_;
      auVar12._0_4_ = auVar62._0_4_;
      auVar12._8_4_ = auVar62._8_4_;
      auVar12._12_4_ = auVar62._8_4_;
      auVar73 = pshuflw(auVar87,auVar12,0xe8);
      auVar41._0_4_ = -(uint)(auVar39._0_4_ == iVar48);
      auVar41._4_4_ = -(uint)(auVar39._4_4_ == iVar50);
      auVar41._8_4_ = -(uint)(auVar39._8_4_ == iVar71);
      auVar41._12_4_ = -(uint)(auVar39._12_4_ == iVar72);
      auVar77._4_4_ = auVar41._4_4_;
      auVar77._0_4_ = auVar41._4_4_;
      auVar77._8_4_ = auVar41._12_4_;
      auVar77._12_4_ = auVar41._12_4_;
      auVar39 = pshuflw(auVar41,auVar77,0xe8);
      auVar78._4_4_ = auVar62._4_4_;
      auVar78._0_4_ = auVar62._4_4_;
      auVar78._8_4_ = auVar62._12_4_;
      auVar78._12_4_ = auVar62._12_4_;
      auVar69 = pshuflw(auVar62,auVar78,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 & auVar73,(auVar69 | auVar39 & auVar73) ^ auVar2);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        buf[uVar27 + 4] = (char)(uVar34 / 0xfb) * '\x05' + '\x04' + cVar23;
      }
      auVar13._4_4_ = auVar62._0_4_;
      auVar13._0_4_ = auVar62._0_4_;
      auVar13._8_4_ = auVar62._8_4_;
      auVar13._12_4_ = auVar62._8_4_;
      auVar78 = auVar77 & auVar13 | auVar78;
      auVar69 = packssdw(auVar78,auVar78);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39,auVar69 ^ auVar3);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._4_2_ >> 8 & 1) != 0) {
        buf[uVar27 + 5] = (char)(uVar37 / 0xfb) * '\x05' + '\x05' + cVar23;
      }
      auVar39 = auVar56 ^ auVar24;
      auVar63._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar63._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar63._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar63._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar79._4_4_ = auVar63._0_4_;
      auVar79._0_4_ = auVar63._0_4_;
      auVar79._8_4_ = auVar63._8_4_;
      auVar79._12_4_ = auVar63._8_4_;
      iVar86 = -(uint)(auVar39._4_4_ == iVar50);
      iVar90 = -(uint)(auVar39._12_4_ == iVar72);
      auVar14._4_4_ = iVar86;
      auVar14._0_4_ = iVar86;
      auVar14._8_4_ = iVar90;
      auVar14._12_4_ = iVar90;
      auVar88._4_4_ = auVar63._4_4_;
      auVar88._0_4_ = auVar63._4_4_;
      auVar88._8_4_ = auVar63._12_4_;
      auVar88._12_4_ = auVar63._12_4_;
      auVar39 = auVar14 & auVar79 | auVar88;
      auVar39 = packssdw(auVar39,auVar39);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar4,auVar39 ^ auVar4);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        buf[uVar27 + 6] = (char)(uVar36 / 0xfb) * '\x05' + '\x06' + cVar23;
      }
      auVar39 = pshufhw(auVar39,auVar79,0x84);
      auVar15._4_4_ = iVar86;
      auVar15._0_4_ = iVar86;
      auVar15._8_4_ = iVar90;
      auVar15._12_4_ = iVar90;
      auVar73 = pshufhw(auVar63,auVar15,0x84);
      auVar69 = pshufhw(auVar39,auVar88,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar69 | auVar73 & auVar39) ^ auVar42;
      auVar39 = packssdw(auVar42,auVar42);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._6_2_ >> 8 & 1) != 0) {
        buf[uVar27 + 7] = (char)(uVar29 / 0xfb) * '\x05' + '\a' + cVar23;
      }
      auVar39 = auVar55 ^ auVar24;
      auVar64._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar64._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar64._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar64._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar16._4_4_ = auVar64._0_4_;
      auVar16._0_4_ = auVar64._0_4_;
      auVar16._8_4_ = auVar64._8_4_;
      auVar16._12_4_ = auVar64._8_4_;
      auVar73 = pshuflw(auVar88,auVar16,0xe8);
      auVar43._0_4_ = -(uint)(auVar39._0_4_ == iVar48);
      auVar43._4_4_ = -(uint)(auVar39._4_4_ == iVar50);
      auVar43._8_4_ = -(uint)(auVar39._8_4_ == iVar71);
      auVar43._12_4_ = -(uint)(auVar39._12_4_ == iVar72);
      auVar80._4_4_ = auVar43._4_4_;
      auVar80._0_4_ = auVar43._4_4_;
      auVar80._8_4_ = auVar43._12_4_;
      auVar80._12_4_ = auVar43._12_4_;
      auVar39 = pshuflw(auVar43,auVar80,0xe8);
      auVar81._4_4_ = auVar64._4_4_;
      auVar81._0_4_ = auVar64._4_4_;
      auVar81._8_4_ = auVar64._12_4_;
      auVar81._12_4_ = auVar64._12_4_;
      auVar69 = pshuflw(auVar64,auVar81,0xe8);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar69 | auVar39 & auVar73) ^ auVar65;
      auVar69 = packssdw(auVar65,auVar65);
      auVar39 = packsswb(auVar39 & auVar73,auVar69);
      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        buf[uVar27 + 8] = (char)(uVar28 / 0xfb) * '\x05' + '\b' + cVar23;
      }
      auVar17._4_4_ = auVar64._0_4_;
      auVar17._0_4_ = auVar64._0_4_;
      auVar17._8_4_ = auVar64._8_4_;
      auVar17._12_4_ = auVar64._8_4_;
      auVar81 = auVar80 & auVar17 | auVar81;
      auVar69 = packssdw(auVar81,auVar81);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar69 = packssdw(auVar69 ^ auVar5,auVar69 ^ auVar5);
      auVar39 = packsswb(auVar39,auVar69);
      if ((auVar39._8_2_ >> 8 & 1) != 0) {
        buf[uVar27 + 9] = (char)(uVar33 / 0xfb) * '\x05' + '\t' + cVar23;
      }
      auVar39 = auVar54 ^ auVar24;
      auVar66._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar66._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar66._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar66._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar82._4_4_ = auVar66._0_4_;
      auVar82._0_4_ = auVar66._0_4_;
      auVar82._8_4_ = auVar66._8_4_;
      auVar82._12_4_ = auVar66._8_4_;
      iVar86 = -(uint)(auVar39._4_4_ == iVar50);
      iVar90 = -(uint)(auVar39._12_4_ == iVar72);
      auVar18._4_4_ = iVar86;
      auVar18._0_4_ = iVar86;
      auVar18._8_4_ = iVar90;
      auVar18._12_4_ = iVar90;
      auVar89._4_4_ = auVar66._4_4_;
      auVar89._0_4_ = auVar66._4_4_;
      auVar89._8_4_ = auVar66._12_4_;
      auVar89._12_4_ = auVar66._12_4_;
      auVar39 = auVar18 & auVar82 | auVar89;
      auVar39 = packssdw(auVar39,auVar39);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar6,auVar39 ^ auVar6);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        buf[uVar27 + 10] = (char)(uVar32 / 0xfb) * '\x05' + '\n' + cVar23;
      }
      auVar39 = pshufhw(auVar39,auVar82,0x84);
      auVar19._4_4_ = iVar86;
      auVar19._0_4_ = iVar86;
      auVar19._8_4_ = iVar90;
      auVar19._12_4_ = iVar90;
      auVar73 = pshufhw(auVar66,auVar19,0x84);
      auVar69 = pshufhw(auVar39,auVar89,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar69 | auVar73 & auVar39) ^ auVar44;
      auVar39 = packssdw(auVar44,auVar44);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._10_2_ >> 8 & 1) != 0) {
        buf[uVar27 + 0xb] = (char)(uVar31 / 0xfb) * '\x05' + '\v' + cVar23;
      }
      auVar39 = auVar53 ^ auVar24;
      auVar67._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar67._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar67._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar67._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar20._4_4_ = auVar67._0_4_;
      auVar20._0_4_ = auVar67._0_4_;
      auVar20._8_4_ = auVar67._8_4_;
      auVar20._12_4_ = auVar67._8_4_;
      auVar73 = pshuflw(auVar89,auVar20,0xe8);
      auVar45._0_4_ = -(uint)(auVar39._0_4_ == iVar48);
      auVar45._4_4_ = -(uint)(auVar39._4_4_ == iVar50);
      auVar45._8_4_ = -(uint)(auVar39._8_4_ == iVar71);
      auVar45._12_4_ = -(uint)(auVar39._12_4_ == iVar72);
      auVar83._4_4_ = auVar45._4_4_;
      auVar83._0_4_ = auVar45._4_4_;
      auVar83._8_4_ = auVar45._12_4_;
      auVar83._12_4_ = auVar45._12_4_;
      auVar39 = pshuflw(auVar45,auVar83,0xe8);
      auVar84._4_4_ = auVar67._4_4_;
      auVar84._0_4_ = auVar67._4_4_;
      auVar84._8_4_ = auVar67._12_4_;
      auVar84._12_4_ = auVar67._12_4_;
      auVar69 = pshuflw(auVar67,auVar84,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 & auVar73,(auVar69 | auVar39 & auVar73) ^ auVar7);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        buf[uVar27 + 0xc] = (char)(local_60 / 0xfb) * '\x05' + '\f' + cVar23;
      }
      auVar21._4_4_ = auVar67._0_4_;
      auVar21._0_4_ = auVar67._0_4_;
      auVar21._8_4_ = auVar67._8_4_;
      auVar21._12_4_ = auVar67._8_4_;
      auVar84 = auVar83 & auVar21 | auVar84;
      auVar69 = packssdw(auVar84,auVar84);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39,auVar69 ^ auVar8);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._12_2_ >> 8 & 1) != 0) {
        buf[uVar27 + 0xd] = (char)(local_5c / 0xfb) * '\x05' + '\r' + cVar23;
      }
      auVar39 = auVar51 ^ auVar24;
      auVar68._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
      auVar68._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
      auVar68._8_4_ = -(uint)(iVar71 < auVar39._8_4_);
      auVar68._12_4_ = -(uint)(iVar72 < auVar39._12_4_);
      auVar85._4_4_ = auVar68._0_4_;
      auVar85._0_4_ = auVar68._0_4_;
      auVar85._8_4_ = auVar68._8_4_;
      auVar85._12_4_ = auVar68._8_4_;
      iVar48 = -(uint)(auVar39._4_4_ == iVar50);
      iVar50 = -(uint)(auVar39._12_4_ == iVar72);
      auVar70._4_4_ = iVar48;
      auVar70._0_4_ = iVar48;
      auVar70._8_4_ = iVar50;
      auVar70._12_4_ = iVar50;
      auVar46._4_4_ = auVar68._4_4_;
      auVar46._0_4_ = auVar68._4_4_;
      auVar46._8_4_ = auVar68._12_4_;
      auVar46._12_4_ = auVar68._12_4_;
      auVar46 = auVar70 & auVar85 | auVar46;
      auVar39 = packssdw(auVar46,auVar46);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar9,auVar39 ^ auVar9);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        buf[uVar27 + 0xe] = (char)(local_58 / 0xfb) * '\x05' + '\x0e' + cVar23;
      }
      auVar39 = pshufhw(auVar39,auVar85,0x84);
      auVar69 = pshufhw(auVar68,auVar70,0x84);
      in_XMM11 = auVar69 & auVar39;
      auVar22._4_4_ = auVar68._4_4_;
      auVar22._0_4_ = auVar68._4_4_;
      auVar22._8_4_ = auVar68._12_4_;
      auVar22._12_4_ = auVar68._12_4_;
      auVar39 = pshufhw(auVar39,auVar22,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar39 | in_XMM11) ^ auVar47;
      auVar39 = packssdw(auVar47,auVar47);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._14_2_ >> 8 & 1) != 0) {
        buf[uVar27 + 0xf] = (char)(local_54 / 0xfb) * '\x05' + '\x0f' + cVar23;
      }
      uVar27 = uVar27 + 0x10;
      lVar25 = (long)DAT_001040a0;
      lVar52 = auVar59._8_8_;
      auVar59._0_8_ = auVar59._0_8_ + lVar25;
      lVar49 = DAT_001040a0._8_8_;
      auVar59._8_8_ = lVar52 + lVar49;
      lVar52 = auVar58._8_8_;
      auVar58._0_8_ = auVar58._0_8_ + lVar25;
      auVar58._8_8_ = lVar52 + lVar49;
      lVar52 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + lVar25;
      auVar57._8_8_ = lVar52 + lVar49;
      lVar52 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + lVar25;
      auVar56._8_8_ = lVar52 + lVar49;
      lVar52 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + lVar25;
      auVar55._8_8_ = lVar52 + lVar49;
      lVar52 = auVar54._8_8_;
      auVar54._0_8_ = auVar54._0_8_ + lVar25;
      auVar54._8_8_ = lVar52 + lVar49;
      lVar52 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + lVar25;
      auVar53._8_8_ = lVar52 + lVar49;
      lVar52 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + lVar25;
      auVar51._8_8_ = lVar52 + lVar49;
      local_54 = local_54 + 0x10;
      local_58 = local_58 + 0x10;
      local_5c = local_5c + 0x10;
      local_60 = local_60 + 0x10;
      uVar31 = (ulong)((int)uVar31 + 0x10);
      uVar32 = (ulong)((int)uVar32 + 0x10);
      uVar33 = (ulong)((int)uVar33 + 0x10);
      uVar28 = (ulong)((int)uVar28 + 0x10);
      uVar29 = (ulong)((int)uVar29 + 0x10);
      uVar36 = (ulong)((int)uVar36 + 0x10);
      uVar37 = (ulong)((int)uVar37 + 0x10);
      uVar34 = (ulong)((int)uVar34 + 0x10);
      uVar35 = (ulong)((int)uVar35 + 0x10);
      in_EAX = (int)uVar26 + 0x10;
      uVar26 = (ulong)in_EAX;
      uVar30 = (ulong)((int)uVar30 + 0x10);
      auVar39 = _DAT_001040a0;
    } while ((len + 0xfU & 0xfffffff0) != uVar27);
  }
  return in_EAX;
}

Assistant:

int generate_input(uint8_t *buf, int len)
{
	for (int i = 0; i < len; i++) {
		buf[i] = i % TEST_INPUT_MODULO;
	}
}